

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo_FEA_basic.cpp
# Opt level: O2

void test_1(void)

{
  element_type *peVar1;
  element_type *peVar2;
  element_type *peVar3;
  ChStreamOutAscii *pCVar4;
  undefined1 auVar5 [16];
  shared_ptr<chrono::fea::ChNodeFEAxyz> mnodeB;
  shared_ptr<chrono::fea::ChNodeFEAxyz> mnodeA;
  shared_ptr<chrono::fea::ChMesh> my_mesh;
  shared_ptr<chrono::fea::ChLinkPointFrame> constraintA;
  shared_ptr<chrono::ChBody> truss;
  shared_ptr<chrono::fea::ChElementSpring> melementA;
  shared_ptr<chrono::ChSolverMINRES> solver;
  __shared_ptr<chrono::ChSolver,(__gnu_cxx::_Lock_policy)2> local_4a8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_4a0;
  __shared_ptr<chrono::ChPhysicsItem,(__gnu_cxx::_Lock_policy)2> local_498 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_490;
  __shared_ptr<chrono::ChBodyFrame,(__gnu_cxx::_Lock_policy)2> local_488 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_480;
  __shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2> local_478;
  __shared_ptr<chrono::ChPhysicsItem,(__gnu_cxx::_Lock_policy)2> local_468 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_460;
  __shared_ptr<chrono::ChPhysicsItem,(__gnu_cxx::_Lock_policy)2> local_458 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_450;
  __shared_ptr<chrono::fea::ChElementBase,(__gnu_cxx::_Lock_policy)2> local_448 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_440;
  __shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2> local_438;
  __shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2> local_428;
  __shared_ptr<chrono::fea::ChNodeFEAbase,(__gnu_cxx::_Lock_policy)2> local_418 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_410;
  __shared_ptr<chrono::fea::ChNodeFEAbase,(__gnu_cxx::_Lock_policy)2> local_408 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_400;
  undefined1 local_3f8 [16];
  double local_3e8;
  undefined1 local_3d8 [16];
  undefined8 local_3c8;
  ChSystemSMC sys;
  
  pCVar4 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::ChStreamOutAscii::operator<<
            (pCVar4,"\n-------------------------------------------------\n");
  pCVar4 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::ChStreamOutAscii::operator<<(pCVar4,"TEST: spring element FEM  \n\n");
  chrono::ChSystemSMC::ChSystemSMC(&sys,true);
  std::make_shared<chrono::fea::ChMesh>();
  local_3e8 = 0.0;
  local_3f8 = ZEXT816(0);
  std::make_shared<chrono::fea::ChNodeFEAxyz,chrono::ChVector<double>>((ChVector<double> *)&mnodeA);
  local_3f8 = vmovhps_avx(ZEXT816(0) << 0x40,0x3ff0000000000000);
  local_3e8 = 0.0;
  std::make_shared<chrono::fea::ChNodeFEAxyz,chrono::ChVector<double>>((ChVector<double> *)&mnodeB);
  (**(code **)(*(long *)mnodeA.
                        super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr + 0x50))(0x3f847ae147ae147b);
  (**(code **)(*(long *)mnodeB.
                        super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr + 0x50))(0x3f847ae147ae147b);
  local_3d8 = vmovhps_avx(ZEXT816(0) << 0x40,0x4014000000000000);
  local_3c8 = 0;
  (**(code **)(*(long *)mnodeB.
                        super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr + 0x68))();
  peVar1 = my_mesh.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_ptr<chrono::fea::ChNodeFEAbase,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::fea::ChNodeFEAxyz,void>
            (local_408,
             &mnodeA.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>);
  chrono::fea::ChMesh::AddNode(peVar1,local_408);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_400);
  peVar1 = my_mesh.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_ptr<chrono::fea::ChNodeFEAbase,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::fea::ChNodeFEAxyz,void>
            (local_418,
             &mnodeB.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>);
  chrono::fea::ChMesh::AddNode(peVar1,local_418);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_410);
  std::make_shared<chrono::fea::ChElementSpring>();
  peVar3 = melementA.super___shared_ptr<chrono::fea::ChElementSpring,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  std::__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_428,
             &mnodeA.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_438,
             &mnodeB.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>);
  (**(code **)(*(long *)peVar3 + 0xb0))(peVar3,&local_428,&local_438);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_438._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_428._M_refcount);
  (**(code **)(*(long *)melementA.
                        super___shared_ptr<chrono::fea::ChElementSpring,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr + 0xb8))(0x40f86a0000000000);
  std::__shared_ptr<chrono::fea::ChElementBase,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::fea::ChElementSpring,void>
            (local_448,
             &melementA.super___shared_ptr<chrono::fea::ChElementSpring,_(__gnu_cxx::_Lock_policy)2>
            );
  chrono::fea::ChMesh::AddElement
            (my_mesh.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             local_448);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_440);
  std::__shared_ptr<chrono::ChPhysicsItem,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::fea::ChMesh,void>
            (local_458,&my_mesh.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>)
  ;
  chrono::ChSystem::Add(&sys,local_458);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_450);
  chrono_types::make_shared<chrono::ChBody,_0>();
  chrono::ChBody::SetBodyFixed
            ((bool)truss.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_
            );
  std::__shared_ptr<chrono::ChPhysicsItem,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::ChBody,void>
            (local_468,&truss.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>);
  chrono::ChSystem::Add(&sys,local_468);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_460);
  std::make_shared<chrono::fea::ChLinkPointFrame>();
  peVar2 = constraintA.super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  std::__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_478,
             &mnodeA.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<chrono::ChBodyFrame,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::ChBody,void>
            (local_488,&truss.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>);
  (**(code **)(*(long *)peVar2 + 0x220))(peVar2,&local_478,local_488,0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_480);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_478._M_refcount);
  std::__shared_ptr<chrono::ChPhysicsItem,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::fea::ChLinkPointFrame,void>
            (local_498,
             &constraintA.
              super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>);
  chrono::ChSystem::Add(&sys,local_498);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_490);
  std::make_shared<chrono::ChSolverMINRES>();
  std::__shared_ptr<chrono::ChSolver,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::ChSolverMINRES,void>
            (local_4a8,
             &solver.super___shared_ptr<chrono::ChSolverMINRES,_(__gnu_cxx::_Lock_policy)2>);
  chrono::ChSystem::SetSolver(&sys,local_4a8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_4a0);
  *(undefined4 *)
   (solver.super___shared_ptr<chrono::ChSolverMINRES,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 0xc) =
       0x28;
  *(undefined8 *)
   (solver.super___shared_ptr<chrono::ChSolverMINRES,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 0x10) =
       0x3ddb7cdfd9d7bdbb;
  solver.super___shared_ptr<chrono::ChSolverMINRES,_(__gnu_cxx::_Lock_policy)2>._M_ptr[8] =
       (element_type)0x1;
  solver.super___shared_ptr<chrono::ChSolverMINRES,_(__gnu_cxx::_Lock_policy)2>._M_ptr[0x20] =
       (element_type)0x1;
  chrono::ChSystem::DoStaticLinear();
  pCVar4 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::ChStreamOutAscii::operator<<(pCVar4,"poss after linear static analysis: \n");
  pCVar4 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar4 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar4,"  nodeA->pos \n");
  chrono::operator<<(pCVar4,(ChVector<double> *)
                            (mnodeA.
                             super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr + 0x20));
  pCVar4 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar4 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar4,"  nodeB->pos \n");
  chrono::operator<<(pCVar4,(ChVector<double> *)
                            (mnodeB.
                             super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr + 0x20));
  pCVar4 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::ChStreamOutAscii::operator<<(pCVar4,"Forces after linear static analysis: \n");
  pCVar4 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar4 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar4,"  constraintA.react \n")
  ;
  auVar5._0_8_ = *(ulong *)(constraintA.
                            super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr + 0x88) ^ 0x8000000000000000;
  auVar5._8_4_ = 0;
  auVar5._12_4_ = 0x80000000;
  local_3f8._0_8_ =
       (ulong)*(double *)
               (constraintA.
                super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               + 0x78) ^ 0x8000000000000000;
  local_3f8._8_4_ =
       *(undefined4 *)
        (constraintA.super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr + 0x80);
  local_3f8._12_4_ =
       *(uint *)(constraintA.
                 super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr + 0x84) ^ 0x80000000;
  local_3e8 = (double)vmovlps_avx(auVar5);
  chrono::operator<<(pCVar4,(ChVector<double> *)local_3f8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&solver.super___shared_ptr<chrono::ChSolverMINRES,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&constraintA.
              super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&truss.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&melementA.super___shared_ptr<chrono::fea::ChElementSpring,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&mnodeB.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&mnodeA.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&my_mesh.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  chrono::ChSystemSMC::~ChSystemSMC(&sys);
  return;
}

Assistant:

void test_1() {
    GetLog() << "\n-------------------------------------------------\n";
    GetLog() << "TEST: spring element FEM  \n\n";

    // The physical system: it contains all physical objects.
    ChSystemSMC sys;

    // Create a mesh, that is a container for groups
    // of elements and their referenced nodes.
    auto my_mesh = chrono_types::make_shared<ChMesh>();

    // Create some nodes. These are the classical point-like
    // nodes with x,y,z degrees of freedom, that can be used
    // for many types of FEM elements in space.
    // While creating them, also set X0 undeformed positions.
    auto mnodeA = chrono_types::make_shared<ChNodeFEAxyz>(ChVector<>(0, 0, 0));
    auto mnodeB = chrono_types::make_shared<ChNodeFEAxyz>(ChVector<>(0, 1, 0));

    // For example, you can attach local 'point masses' (FE node masses are zero by default)
    mnodeA->SetMass(0.01);
    mnodeB->SetMass(0.01);

    // For example, set an applied force to a node:
    mnodeB->SetForce(ChVector<>(0, 5, 0));

    // Remember to add nodes and elements to the mesh!
    my_mesh->AddNode(mnodeA);
    my_mesh->AddNode(mnodeB);

    // Create some elements of 'spring-damper' type, each connecting
    // two 3D nodes:
    auto melementA = chrono_types::make_shared<ChElementSpring>();
    melementA->SetNodes(mnodeA, mnodeB);
    melementA->SetSpringK(100000);

    // Remember to add elements to the mesh!
    my_mesh->AddElement(melementA);

    // Remember to add the mesh to the system!
    sys.Add(my_mesh);

    // Create also a truss
    auto truss = chrono_types::make_shared<ChBody>();
    truss->SetBodyFixed(true);
    sys.Add(truss);

    // Create a constraint between a node and the truss
    auto constraintA = chrono_types::make_shared<ChLinkPointFrame>();

    constraintA->Initialize(mnodeA,  // node to connect
                            truss);  // body to be connected to

    sys.Add(constraintA);

    // Set no gravity
    // sys.Set_G_acc(VNULL);

    // Perform a linear static analysis
    auto solver = chrono_types::make_shared<ChSolverMINRES>();
    sys.SetSolver(solver);
    solver->SetMaxIterations(40);
    solver->SetTolerance(1e-10);
    solver->EnableDiagonalPreconditioner(true);
    solver->SetVerbose(true);

    sys.DoStaticLinear();

    // Output result
    GetLog() << "poss after linear static analysis: \n";
    GetLog() << "  nodeA->pos \n" << mnodeA->GetPos();
    GetLog() << "  nodeB->pos \n" << mnodeB->GetPos();
    GetLog() << "Forces after linear static analysis: \n";
    GetLog() << "  constraintA.react \n" << constraintA->GetReactionOnBody();
}